

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

void ucnv_MBCSToUnicodeWithOffsets_63(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  byte *pbVar1;
  UChar *pUVar2;
  uint8_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  UErrorCode UVar14;
  UConverterSharedData *pUVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  UConverterToUnicodeArgs *pUVar19;
  UBool UVar20;
  char cVar21;
  UChar32 UVar22;
  uint uVar23;
  UChar *pUVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  byte *pbVar29;
  int32_t *piVar30;
  int *piVar31;
  byte *pbVar32;
  UChar UVar33;
  uint32_t uVar34;
  ulong uVar35;
  ulong uVar36;
  UConverter *pUVar37;
  uint uVar38;
  long lVar39;
  int32_t (*stateTable) [256];
  int iVar40;
  int iVar41;
  uint16_t *puVar42;
  byte *pbVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  byte bVar48;
  uint uVar50;
  UChar *target;
  int32_t *offsets;
  byte *local_70;
  UConverterToUnicodeArgs *local_68;
  undefined8 local_60;
  UChar *local_58;
  UConverter *local_50;
  UErrorCode *local_48;
  ulong local_40;
  int32_t (*local_38) [256];
  uint16_t *puVar43;
  uint uVar49;
  
  pUVar37 = pArgs->converter;
  if ('\0' < pUVar37->preToULength) {
    ucnv_extContinueMatchToU_63(pUVar37,pArgs,-1,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      return;
    }
    if (pUVar37->preToULength < '\0') {
      return;
    }
  }
  pUVar15 = pUVar37->sharedData;
  local_68 = pArgs;
  if ((pUVar15->mbcs).countStates == '\x01') {
    if (((pUVar15->mbcs).unicodeMask & 1) == 0) {
      pUVar37 = pArgs->converter;
      local_70 = (byte *)pArgs->source;
      local_60 = (uint16_t *)pArgs->sourceLimit;
      target = pArgs->target;
      offsets = pArgs->offsets;
      uVar35 = (ulong)((long)pArgs->targetLimit - (long)target) >> 1;
      uVar25 = (int)local_60 - (int)local_70;
      uVar26 = (ulong)uVar25;
      if ((int)uVar35 <= (int)uVar25) {
        uVar26 = uVar35 & 0xffffffff;
      }
      lVar45 = *(long *)((pUVar37->sharedData->mbcs).sbcsIndex +
                        (ulong)(((byte)pUVar37->options & 0x10) >> 4) * 4 + -0x18);
      uVar35 = 0;
      pbVar44 = local_70;
      local_48 = pErrorCode;
LAB_002bd800:
      pUVar24 = target;
      pbVar29 = local_70;
      if (0xf < (int)uVar26) {
        uVar36 = uVar26 >> 4;
        lVar47 = 0;
        lVar39 = 0;
        iVar41 = (int)uVar36;
        do {
          iVar46 = (int)uVar36;
          uVar25 = *(uint *)(lVar45 + (ulong)local_70[lVar47] * 4);
          target[lVar47] = (UChar)uVar25;
          uVar50 = *(uint *)(lVar45 + (ulong)local_70[lVar47 + 1] * 4);
          target[lVar47 + 1] = (UChar)uVar50;
          uVar38 = *(uint *)(lVar45 + (ulong)local_70[lVar47 + 2] * 4);
          target[lVar47 + 2] = (UChar)uVar38;
          uVar49 = *(uint *)(lVar45 + (ulong)local_70[lVar47 + 3] * 4);
          target[lVar47 + 3] = (UChar)uVar49;
          uVar28 = *(uint *)(lVar45 + (ulong)local_70[lVar47 + 4] * 4);
          target[lVar47 + 4] = (UChar)uVar28;
          uVar23 = *(uint *)(lVar45 + (ulong)local_70[lVar47 + 5] * 4);
          target[lVar47 + 5] = (UChar)uVar23;
          uVar4 = *(uint *)(lVar45 + (ulong)local_70[lVar47 + 6] * 4);
          target[lVar47 + 6] = (UChar)uVar4;
          pbVar29 = local_70 + lVar47 + 8;
          uVar5 = *(uint *)(lVar45 + (ulong)pbVar29[-1] * 4);
          target[lVar47 + 7] = (UChar)uVar5;
          uVar6 = *(uint *)(lVar45 + (ulong)*pbVar29 * 4);
          target[lVar47 + 8] = (UChar)uVar6;
          uVar7 = *(uint *)(lVar45 + (ulong)pbVar29[1] * 4);
          target[lVar47 + 9] = (UChar)uVar7;
          uVar8 = *(uint *)(lVar45 + (ulong)pbVar29[2] * 4);
          target[lVar47 + 10] = (UChar)uVar8;
          uVar9 = *(uint *)(lVar45 + (ulong)pbVar29[3] * 4);
          target[lVar47 + 0xb] = (UChar)uVar9;
          uVar10 = *(uint *)(lVar45 + (ulong)pbVar29[4] * 4);
          target[lVar47 + 0xc] = (UChar)uVar10;
          uVar11 = *(uint *)(lVar45 + (ulong)pbVar29[5] * 4);
          target[lVar47 + 0xd] = (UChar)uVar11;
          uVar12 = *(uint *)(lVar45 + (ulong)pbVar29[6] * 4);
          target[lVar47 + 0xe] = (UChar)uVar12;
          lVar17 = lVar47 + 0x10;
          uVar13 = *(uint *)(lVar45 + (ulong)local_70[lVar47 + 0xf] * 4);
          lVar18 = lVar39 + 0x20;
          target[lVar47 + 0xf] = (UChar)uVar13;
          if (-0x7ff00001 <
              (int)(uVar9 | uVar10 | uVar11 | uVar12 | uVar13 |
                   uVar5 | uVar6 | uVar7 | uVar8 |
                   uVar28 | uVar23 | uVar4 | uVar38 | uVar49 | uVar25 | uVar50)) {
            pbVar29 = local_70 + lVar47;
            pUVar24 = (UChar *)((long)target + lVar39);
            target = pUVar24;
            local_70 = pbVar29;
            goto LAB_002bda2d;
          }
          lVar39 = lVar39 + 0x20;
          lVar47 = lVar47 + 0x10;
          uVar36 = (ulong)(iVar46 - 1);
        } while (1 < iVar46);
        pUVar24 = (UChar *)((long)target + lVar39);
        pbVar29 = local_70 + lVar47;
        iVar46 = 0;
        target = (UChar *)((long)target + lVar18);
        local_70 = local_70 + lVar17;
LAB_002bda2d:
        uVar25 = iVar41 - iVar46;
        uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10);
        pErrorCode = local_48;
        if ((offsets != (int32_t *)0x0) &&
           (pbVar44 = pbVar44 + (int)(uVar25 * 0x10), 0 < (int)uVar25)) {
          uVar50 = (uint)uVar35;
          do {
            *offsets = uVar50;
            ((uint *)offsets)[1] = uVar50 + 1;
            ((uint *)offsets)[2] = uVar50 + 2;
            ((uint *)offsets)[3] = uVar50 + 3;
            ((uint *)offsets)[4] = uVar50 + 4;
            ((uint *)offsets)[5] = uVar50 + 5;
            ((uint *)offsets)[6] = uVar50 + 6;
            ((uint *)offsets)[7] = uVar50 + 7;
            ((uint *)offsets)[8] = uVar50 + 8;
            ((uint *)offsets)[9] = uVar50 + 9;
            ((uint *)offsets)[10] = uVar50 + 10;
            ((uint *)offsets)[0xb] = uVar50 + 0xb;
            ((uint *)offsets)[0xc] = uVar50 + 0xc;
            ((uint *)offsets)[0xd] = uVar50 + 0xd;
            ((uint *)offsets)[0xe] = uVar50 + 0xe;
            ((uint *)offsets)[0xf] = uVar50 + 0xf;
            offsets = (int32_t *)((uint *)offsets + 0x10);
            uVar50 = uVar50 + 0x10;
            bVar16 = 1 < uVar25;
            uVar25 = uVar25 - 1;
          } while (bVar16);
          uVar35 = (ulong)uVar50;
          pbVar29 = local_70;
        }
      }
      local_70 = pbVar29;
      if (0 < (int)uVar26) {
        pbVar29 = local_70;
        do {
          iVar41 = (int)pbVar29;
          lVar39 = 0;
          uVar25 = (2 - (int)pbVar44) + iVar41;
LAB_002bdadc:
          uVar50 = uVar25;
          local_70 = pbVar29 + lVar39;
          if (local_60 <= local_70) break;
          local_70 = pbVar29 + lVar39 + 1;
          uVar25 = *(uint *)(lVar45 + (ulong)pbVar29[lVar39] * 4);
          if ((-0x7ff00001 < (int)uVar25) && (uVar38 = uVar25 >> 0x14 & 0xf, uVar38 != 2)) {
            lVar39 = lVar39 + 1;
            if (uVar38 != 6) goto code_r0x002bdb21;
            goto LAB_002bdb56;
          }
          target = pUVar24 + 1;
          *pUVar24 = (UChar)uVar25;
          iVar41 = (int)uVar26;
          uVar26 = (ulong)(iVar41 - 1);
          pUVar24 = target;
          pbVar29 = local_70;
        } while (1 < iVar41);
      }
      goto LAB_002be6b5;
    }
    pUVar37 = pArgs->converter;
    pbVar44 = (byte *)pArgs->source;
    pbVar29 = (byte *)pArgs->sourceLimit;
    target = pArgs->target;
    pUVar24 = pArgs->targetLimit;
    offsets = pArgs->offsets;
    local_70 = pbVar44;
    if (pbVar44 < pbVar29) {
      lVar45 = *(long *)((pUVar37->sharedData->mbcs).sbcsIndex +
                        (ulong)(((byte)pUVar37->options & 0x10) >> 4) * 4 + -0x18);
      iVar41 = 0;
      do {
        if (pUVar24 <= target) {
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
          local_70 = pbVar44;
          break;
        }
        local_70 = pbVar44 + 1;
        uVar25 = *(uint *)(lVar45 + (ulong)*pbVar44 * 4);
        UVar33 = (UChar)uVar25;
        if ((int)uVar25 < -0x7ff00000) {
LAB_002be46e:
          pUVar2 = target + 1;
          *target = UVar33;
          pbVar44 = local_70;
          target = pUVar2;
          if (offsets != (int32_t *)0x0) {
            *offsets = iVar41;
            offsets = offsets + 1;
          }
        }
        else if ((uVar25 & 0xd00000) == 0x100000) {
          pUVar2 = target + 1;
          *target = (ushort)(uVar25 >> 10) & 0x3ff | 0xd800;
          if (offsets == (int32_t *)0x0) {
            UVar33 = UVar33 & 0x3ffU | 0xdc00;
            piVar30 = offsets;
            if (pUVar24 <= pUVar2) {
LAB_002be665:
              offsets = piVar30;
              pUVar37->UCharErrorBuffer[0] = UVar33;
              pUVar37->UCharErrorBufferLength = '\x01';
              *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
              target = pUVar2;
              break;
            }
            target[1] = UVar33;
            pbVar44 = local_70;
            target = target + 2;
          }
          else {
            *offsets = iVar41;
            UVar33 = UVar33 & 0x3ffU | 0xdc00;
            piVar30 = offsets + 1;
            if (pUVar24 <= pUVar2) goto LAB_002be665;
            target[1] = UVar33;
            offsets[1] = iVar41;
            pbVar44 = local_70;
            target = target + 2;
            offsets = offsets + 2;
          }
        }
        else {
          uVar25 = uVar25 >> 0x14 & 0xf;
          if (uVar25 == 2) goto LAB_002be46e;
          if (uVar25 == 6) {
            if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
              local_68->source = (char *)local_70;
              pUVar37->toUBytes[0] = *pbVar44;
              piVar30 = (pUVar37->sharedData->mbcs).extIndexes;
              if ((piVar30 == (int32_t *)0x0) ||
                 (UVar20 = ucnv_extInitialMatchToU_63
                                     (pUVar37,piVar30,1,(char **)&local_70,(char *)pbVar29,&target,
                                      pUVar24,&offsets,iVar41,local_68->flush,pErrorCode),
                 UVar20 == '\0')) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                pUVar37->toULength = '\x01';
              }
              else {
                UVar14 = *pErrorCode;
                pUVar37->toULength = '\0';
                if (UVar14 < U_ILLEGAL_ARGUMENT_ERROR) {
                  iVar41 = iVar41 + ((int)local_70 - *(int *)&local_68->source);
                  pbVar44 = local_70;
                  goto LAB_002be556;
                }
              }
            }
            break;
          }
          pbVar44 = local_70;
          if (uVar25 == 7) {
            *pErrorCode = U_ILLEGAL_CHAR_FOUND;
            break;
          }
        }
LAB_002be556:
        iVar41 = iVar41 + 1;
        local_70 = pbVar44;
      } while (pbVar44 < pbVar29);
    }
    local_68->source = (char *)local_70;
    local_68->target = target;
    local_68->offsets = offsets;
    return;
  }
  pbVar29 = (byte *)pArgs->source;
  pbVar44 = (byte *)pArgs->sourceLimit;
  target = pArgs->target;
  local_58 = pArgs->targetLimit;
  offsets = pArgs->offsets;
  uVar25 = pUVar37->mode;
  if ((char)uVar25 == '\0') {
    uVar25 = (uint)(pUVar15->mbcs).dbcsOnlyState;
  }
  puVar42 = (uint16_t *)CONCAT71((int7)((ulong)pArgs >> 8),pUVar37->toULength);
  uVar34 = pUVar37->toUnicodeStatus;
  if (pbVar29 < pbVar44) {
    stateTable = *(int32_t (**) [256])
                  ((pUVar15->mbcs).sbcsIndex +
                  (ulong)(((byte)pUVar37->options & 0x10) >> 4) * 4 + -0x18);
    local_60 = (pUVar15->mbcs).unicodeCodeUnits;
    iVar46 = 0;
    iVar41 = -(uint)(pUVar37->toULength != '\0');
    puVar43 = puVar42;
LAB_002bdcda:
    iVar40 = (int)puVar43;
    puVar42 = puVar43;
    if (local_58 <= target) goto LAB_002be613;
    if ((char)puVar43 == '\0') {
      piVar30 = offsets;
      if (offsets == (int32_t *)0x0) {
        do {
          uVar50 = *(uint *)((long)*stateTable +
                            (ulong)*pbVar29 * 4 + (ulong)((uVar25 & 0xff) << 10));
          uVar26 = (ulong)uVar50;
          if ((int)uVar50 < 0) {
            if (0x800fffff < uVar50) goto LAB_002be19d;
            pbVar29 = pbVar29 + 1;
            *target = (UChar)uVar50;
            uVar25 = 0;
          }
          else {
            uVar25 = uVar50 >> 0x18;
            uVar34 = uVar50 & 0xffffff;
            pbVar1 = pbVar29 + 1;
            pbVar32 = pbVar29;
            if (pbVar44 <= pbVar1) goto LAB_002bdf1d;
            uVar50 = *(uint *)((long)*stateTable + (ulong)*pbVar1 * 4 + (ulong)(uVar25 << 10));
            uVar26 = (ulong)uVar50;
            if (((uVar50 & 0x80f00000) != 0x80400000) ||
               (0xfffd < local_60[(uVar50 & 0xffff) + uVar34])) goto LAB_002bdf1d;
            pbVar29 = pbVar29 + 2;
            *target = local_60[(uVar50 & 0xffff) + uVar34];
            uVar25 = (uint)((byte)(uVar50 >> 0x18) & 0x7f);
            uVar34 = 0;
          }
          target = target + 1;
          puVar43 = (uint16_t *)0x0;
          puVar42 = (uint16_t *)0x0;
        } while ((pbVar29 < pbVar44) && (target < local_58));
      }
      else {
        do {
          uVar50 = *(uint *)((long)*stateTable +
                            (ulong)*pbVar29 * 4 + (ulong)((uVar25 & 0xff) << 10));
          uVar26 = (ulong)uVar50;
          if (-1 < (int)uVar50) {
            uVar25 = uVar50 >> 0x18;
            uVar34 = uVar50 & 0xffffff;
            pbVar1 = pbVar29 + 1;
            puVar43 = puVar42;
            if (pbVar1 < pbVar44) {
              uVar50 = *(uint *)((long)*stateTable + (ulong)*pbVar1 * 4 + (ulong)(uVar25 << 10));
              uVar26 = (ulong)uVar50;
              if (((uVar50 & 0x80f00000) == 0x80400000) &&
                 (puVar43 = local_60, local_60[(uVar50 & 0xffff) + uVar34] < 0xfffe)) {
                pbVar29 = pbVar29 + 2;
                *target = local_60[(uVar50 & 0xffff) + uVar34];
                if (piVar30 == (int *)0x0) {
                  piVar31 = (int *)0x0;
                }
                else {
                  piVar31 = piVar30 + 1;
                  *piVar30 = iVar41;
                  iVar46 = iVar46 + 2;
                  offsets = piVar31;
                  iVar41 = iVar46;
                }
                uVar25 = (uint)((byte)(uVar50 >> 0x18) & 0x7f);
                uVar34 = 0;
                goto LAB_002bde33;
              }
            }
            iVar46 = iVar46 + 1;
            pbVar32 = pbVar29;
            goto LAB_002bdf1d;
          }
          if (0x800fffff < uVar50) goto LAB_002be19d;
          pbVar29 = pbVar29 + 1;
          *target = (UChar)uVar50;
          if (piVar30 == (int *)0x0) {
            piVar31 = (int *)0x0;
            uVar25 = 0;
          }
          else {
            piVar31 = piVar30 + 1;
            *piVar30 = iVar41;
            iVar46 = iVar46 + 1;
            uVar25 = 0;
            offsets = piVar31;
            iVar41 = iVar46;
          }
LAB_002bde33:
          target = target + 1;
          puVar42 = (uint16_t *)0x0;
        } while ((pbVar29 < pbVar44) && (piVar30 = piVar31, target < local_58));
      }
      goto LAB_002bdf28;
    }
    bVar48 = *pbVar29;
    pUVar37->toUBytes[(char)puVar43] = bVar48;
    uVar26 = (ulong)*(uint *)((long)*stateTable + (ulong)bVar48 * 4 + (ulong)((uVar25 & 0xff) << 10)
                             );
    goto LAB_002bdf4f;
  }
LAB_002be61a:
  uVar35 = (ulong)puVar42 & 0xffffffff;
  goto LAB_002be620;
code_r0x002bdb21:
  uVar25 = uVar50 + 1;
  if (uVar38 != 7) goto LAB_002bdadc;
  *pErrorCode = U_ILLEGAL_CHAR_FOUND;
LAB_002bdb56:
  iVar46 = (int)lVar39;
  if ((offsets != (int32_t *)0x0) && (1 < (iVar41 - (int)pbVar44) + iVar46)) {
    do {
      *offsets = (int)uVar35;
      offsets = offsets + 1;
      uVar35 = (ulong)((int)uVar35 + 1);
      uVar50 = uVar50 - 1;
    } while (2 < uVar50);
  }
  if (U_ZERO_ERROR < *pErrorCode) goto LAB_002be6b5;
  pbVar44 = pbVar29 + lVar39;
  pUVar37->toUBytes[0] = pbVar44[-1];
  piVar30 = (pUVar37->sharedData->mbcs).extIndexes;
  iVar40 = (int)uVar35;
  if ((piVar30 == (int32_t *)0x0) ||
     (UVar20 = ucnv_extInitialMatchToU_63
                         (pUVar37,piVar30,1,(char **)&local_70,(char *)local_60,&target,
                          local_68->targetLimit,&offsets,iVar40,local_68->flush,pErrorCode),
     UVar20 == '\0')) {
    *pErrorCode = U_INVALID_CHAR_FOUND;
    pUVar37->toULength = '\x01';
    uVar35 = (ulong)((((iVar40 + (int)local_70) - iVar41) - iVar46) + 1);
    pbVar44 = pbVar29 + lVar39;
    goto LAB_002be6b5;
  }
  UVar14 = *pErrorCode;
  pUVar37->toULength = '\0';
  iVar27 = (int)local_70;
  if (U_ZERO_ERROR < UVar14) {
    pbVar44 = pbVar29 + lVar39;
    uVar35 = (ulong)((((iVar40 + iVar27) - iVar41) - iVar46) + 1);
LAB_002be6b5:
    if (((*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) && (local_70 < local_60)) &&
       (local_68->targetLimit <= target)) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    if (offsets == (int32_t *)0x0) {
      offsets = (int *)0x0;
    }
    else if (local_70 != pbVar44) {
      lVar45 = (long)pbVar44 - (long)local_70;
      do {
        *offsets = (int)uVar35;
        offsets = offsets + 1;
        uVar35 = (ulong)((int)uVar35 + 1);
        lVar45 = lVar45 + 1;
      } while (lVar45 != 0);
    }
    local_68->source = (char *)local_70;
    local_68->target = target;
    local_68->offsets = offsets;
    return;
  }
  uVar35 = (ulong)((long)local_68->targetLimit - (long)target) >> 1;
  uVar25 = (int)local_60 - iVar27;
  uVar26 = (ulong)uVar25;
  if ((int)uVar35 <= (int)uVar25) {
    uVar26 = uVar35 & 0xffffffff;
  }
  uVar35 = ((ulong)(1 - iVar41) + (ulong)(uint)(iVar40 + iVar27)) - lVar39 & 0xffffffff;
  goto LAB_002bd800;
LAB_002be19d:
  puVar42 = (uint16_t *)0x0;
  goto LAB_002bdf28;
LAB_002bdf1d:
  pbVar29 = pbVar1;
  pUVar37->toUBytes[0] = *pbVar32;
  puVar42 = (uint16_t *)CONCAT71((int7)((ulong)puVar43 >> 8),1);
LAB_002bdf28:
  iVar40 = (int)puVar42;
  if (pbVar44 <= pbVar29) goto LAB_002be61a;
  if (local_58 <= target) {
LAB_002be613:
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    goto LAB_002be61a;
  }
  pUVar37->toUBytes[(ulong)puVar42 & 0xff] = *pbVar29;
LAB_002bdf4f:
  pUVar24 = target;
  pbVar29 = pbVar29 + 1;
  uVar35 = (ulong)(iVar40 + 1);
  iVar46 = iVar46 + 1;
  uVar50 = (uint)uVar26;
  if (-1 < (int)uVar50) {
    uVar34 = uVar34 + (uVar50 & 0xffffff);
    uVar25 = (uint)(uVar26 >> 0x18);
    goto LAB_002be189;
  }
  pUVar37->mode = uVar25 & 0xff;
  bVar48 = (byte)(uVar26 >> 0x18) & 0x7f;
  uVar49 = (uint)bVar48;
  uVar38 = (uint)bVar48;
  uVar28 = (uint)(uVar26 >> 0x14) & 0xf;
  UVar33 = (UChar)uVar26;
  if ((uVar26 >> 0x14 & 0xf) == 0) {
switchD_002be155_caseD_2:
    *target = UVar33;
LAB_002be164:
    target = target + 1;
    if (offsets != (int32_t *)0x0) {
      *offsets = iVar41;
      offsets = offsets + 1;
    }
  }
  else {
    uVar23 = (uint)bVar48;
    local_70 = pbVar29;
    if (uVar28 == 5) {
      UVar33 = local_60[uVar34 + (uVar50 & 0xffff)];
      if (0xd7ff < (ushort)UVar33) {
        uVar25 = (uVar50 & 0xffff) + uVar34 + 1;
        if (0xdfff < (ushort)UVar33) {
          if ((UVar33 & 0xfffeU) != 0xe000) {
            if (UVar33 == L'\xffff') goto LAB_002be1a8;
            goto switchD_002be155_caseD_6;
          }
          UVar33 = local_60[uVar25];
          goto LAB_002bdfb3;
        }
        *target = UVar33 & 0xdbff;
        if (offsets == (int32_t *)0x0) {
          piVar30 = offsets;
          if (local_58 <= target + 1) goto LAB_002be7e8;
          target[1] = local_60[uVar25];
          target = target + 2;
        }
        else {
          *offsets = iVar41;
          piVar30 = offsets + 1;
          if (local_58 <= target + 1) {
LAB_002be7e8:
            offsets = piVar30;
            pUVar37->UCharErrorBuffer[0] = local_60[uVar25];
            goto LAB_002be7fa;
          }
          target[1] = local_60[uVar25];
          offsets[1] = iVar41;
          target = target + 2;
          offsets = offsets + 2;
        }
        goto LAB_002be17d;
      }
      *target = UVar33;
      goto LAB_002be164;
    }
    if (uVar28 == 4) {
      uVar25 = uVar34 + (uVar50 & 0xffff);
      UVar33 = local_60[uVar25];
      if ((ushort)UVar33 < 0xfffe) {
LAB_002bdfb3:
        *target = UVar33;
        goto LAB_002be164;
      }
      if (UVar33 != L'\xfffe') goto switchD_002be155_caseD_7;
      local_50 = pUVar37;
      local_48 = pErrorCode;
      local_40 = uVar35;
      local_38 = stateTable;
      UVar22 = ucnv_MBCSGetFallback(&pUVar37->sharedData->mbcs,uVar25);
      pUVar37 = local_50;
      uVar35 = local_40;
      stateTable = local_38;
      pErrorCode = local_48;
      if (UVar22 != 0xfffe) {
        target = pUVar24 + 1;
        *pUVar24 = (UChar)UVar22;
        if (offsets != (int32_t *)0x0) {
          *offsets = iVar41;
          offsets = offsets + 1;
        }
        uVar35 = 0;
        uVar34 = 0;
        uVar25 = (uint)bVar48;
        iVar41 = iVar46;
        goto LAB_002be189;
      }
switchD_002be155_caseD_6:
      uVar25 = uVar49;
      cVar21 = (char)uVar35;
      uVar38 = uVar25;
      if (cVar21 != '\0') {
        if (U_ZERO_ERROR < *pErrorCode) {
          uVar34 = 0;
          if ('\x01' < cVar21) {
            uVar3 = (pUVar37->sharedData->mbcs).dbcsOnlyState;
            local_58 = (UChar *)((uVar35 & 0xff) - 1);
            lVar45 = 0;
            local_60 = (uint16_t *)(CONCAT44(local_60._4_4_,uVar25) & 0xffffffff000000ff);
            local_40 = uVar35;
            goto LAB_002be773;
          }
          goto LAB_002be620;
        }
        local_68->source = (char *)pbVar29;
        piVar30 = (pUVar37->sharedData->mbcs).extIndexes;
        if ((piVar30 == (int32_t *)0x0) ||
           (local_50 = pUVar37,
           UVar20 = ucnv_extInitialMatchToU_63
                              (pUVar37,piVar30,(int)cVar21,(char **)&local_70,(char *)pbVar44,
                               &target,local_58,&offsets,iVar41,local_68->flush,pErrorCode),
           pUVar37 = local_50, UVar20 == '\0')) {
          if ((cVar21 == '\x04') && ((pUVar37->options & 0x8000) != 0)) {
            uVar50 = (uint)pUVar37->toUBytes[3] +
                     ((uint)pUVar37->toUBytes[2] * 5 +
                     ((uint)pUVar37->toUBytes[1] +
                     ((uint)pUVar37->toUBytes[0] + (uint)pUVar37->toUBytes[0] * 4) * 2) * 0x276) * 2
            ;
            lVar45 = 0xc;
            do {
              uVar38 = *(uint *)(&UNK_0035d8bc + lVar45);
              if ((*(uint *)(&UNK_0035d8bc + lVar45) <= uVar50) &&
                 (uVar50 <= *(uint *)((long)gb18030Ranges[0] + lVar45))) {
                *pErrorCode = U_ZERO_ERROR;
                ucnv_toUWriteCodePoint_63
                          (pUVar37,(uVar50 - uVar38) + *(int *)("" + lVar45 + 0xe),&target,local_58,
                           &offsets,iVar41,pErrorCode);
                goto LAB_002be233;
              }
              lVar45 = lVar45 + 0x10;
            } while ((int)lVar45 != 0xec);
          }
          *pErrorCode = U_INVALID_CHAR_FOUND;
        }
        else {
LAB_002be233:
          uVar35 = 0;
        }
        uVar34 = 0;
        pbVar29 = local_70;
        if (U_ZERO_ERROR < *pErrorCode) goto LAB_002be620;
        iVar46 = iVar46 + ((int)local_70 - *(int *)&local_68->source);
        uVar34 = 0;
        iVar41 = iVar46;
        goto LAB_002be189;
      }
    }
    else {
      if ((uVar50 & 0xd00000) != 0x100000) {
        uVar34 = 0;
        switch(uVar28) {
        case 2:
          goto switchD_002be155_caseD_2;
        default:
          uVar35 = 0;
          uVar25 = (uint)bVar48;
          iVar41 = iVar46;
          goto LAB_002be189;
        case 6:
          goto switchD_002be155_caseD_6;
        case 7:
switchD_002be155_caseD_7:
          break;
        case 8:
          uVar23 = uVar25;
          if ((pUVar37->sharedData->mbcs).dbcsOnlyState == '\0') goto LAB_002be17d;
        }
LAB_002be1a8:
        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        uVar49 = uVar23;
        goto switchD_002be155_caseD_6;
      }
      *target = (ushort)(uVar26 >> 10) & 0x3ff | 0xd800;
      if (offsets == (int32_t *)0x0) {
        UVar33 = UVar33 & 0x3ffU | 0xdc00;
        piVar30 = offsets;
        if (local_58 <= target + 1) goto LAB_002be730;
        target[1] = UVar33;
        target = target + 2;
      }
      else {
        *offsets = iVar41;
        UVar33 = UVar33 & 0x3ffU | 0xdc00;
        piVar30 = offsets + 1;
        if (local_58 <= target + 1) {
LAB_002be730:
          offsets = piVar30;
          pUVar37->UCharErrorBuffer[0] = UVar33;
LAB_002be7fa:
          target = target + 1;
          pUVar37->UCharErrorBufferLength = '\x01';
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
          uVar35 = 0;
          uVar25 = (uint)bVar48;
          goto LAB_002be808;
        }
        target[1] = UVar33;
        offsets[1] = iVar41;
        target = target + 2;
        offsets = offsets + 2;
      }
    }
  }
LAB_002be17d:
  uVar35 = 0;
  uVar34 = 0;
  uVar25 = uVar38;
  iVar41 = iVar46;
LAB_002be189:
  puVar43 = (uint16_t *)(uVar35 & 0xffffffff);
  if (pbVar44 <= pbVar29) goto LAB_002be620;
  goto LAB_002bdcda;
  while( true ) {
    lVar45 = lVar45 + 1;
    uVar34 = 0;
    uVar35 = local_40;
    if (local_58 == (UChar *)lVar45) break;
LAB_002be773:
    UVar20 = isSingleOrLead(stateTable,(uint8_t)local_60,uVar3 != '\0',pUVar37->toUBytes[lVar45 + 1]
                           );
    pUVar19 = local_68;
    if (UVar20 != '\0') {
      uVar35 = lVar45 + 1;
      cVar21 = (char)iVar40 - (char)lVar45;
      if ((int)pbVar29 - (int)local_68->source < (int)cVar21) {
        cVar21 = (((char)pbVar29 - (char)iVar40) + (char)lVar45) - (char)local_68->source;
        pUVar37->preToULength = cVar21;
        memcpy(pUVar37->preToU,pUVar37->toUBytes + lVar45 + 1,-(long)cVar21);
        pbVar29 = (byte *)pUVar19->source;
LAB_002be808:
        uVar34 = 0;
      }
      else {
        pbVar29 = pbVar29 + -(long)cVar21;
        uVar34 = 0;
      }
      break;
    }
  }
LAB_002be620:
  pUVar37->toUnicodeStatus = uVar34;
  pUVar37->mode = uVar25 & 0xff;
  pUVar37->toULength = (int8_t)uVar35;
  local_68->source = (char *)pbVar29;
  local_68->target = target;
  local_68->offsets = offsets;
  return;
}

Assistant:

U_CFUNC void
ucnv_MBCSToUnicodeWithOffsets(UConverterToUnicodeArgs *pArgs,
                          UErrorCode *pErrorCode) {
    UConverter *cnv;
    const uint8_t *source, *sourceLimit;
    UChar *target;
    const UChar *targetLimit;
    int32_t *offsets;

    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state;
    int8_t byteIndex;
    uint8_t *bytes;

    int32_t sourceIndex, nextSourceIndex;

    int32_t entry;
    UChar c;
    uint8_t action;

    /* use optimized function if possible */
    cnv=pArgs->converter;

    if(cnv->preToULength>0) {
        /*
         * pass sourceIndex=-1 because we continue from an earlier buffer
         * in the future, this may change with continuous offsets
         */
        ucnv_extContinueMatchToU(cnv, pArgs, -1, pErrorCode);

        if(U_FAILURE(*pErrorCode) || cnv->preToULength<0) {
            return;
        }
    }

    if(cnv->sharedData->mbcs.countStates==1) {
        if(!(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY)) {
            ucnv_MBCSSingleToBMPWithOffsets(pArgs, pErrorCode);
        } else {
            ucnv_MBCSSingleToUnicodeWithOffsets(pArgs, pErrorCode);
        }
        return;
    }

    /* set up the local pointers */
    source=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;
    target=pArgs->target;
    targetLimit=pArgs->targetLimit;
    offsets=pArgs->offsets;

    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }
    unicodeCodeUnits=cnv->sharedData->mbcs.unicodeCodeUnits;

    /* get the converter state from UConverter */
    offset=cnv->toUnicodeStatus;
    byteIndex=cnv->toULength;
    bytes=cnv->toUBytes;

    /*
     * if we are in the SBCS state for a DBCS-only converter,
     * then load the DBCS state from the MBCS data
     * (dbcsOnlyState==0 if it is not a DBCS-only converter)
     */
    if((state=(uint8_t)(cnv->mode))==0) {
        state=cnv->sharedData->mbcs.dbcsOnlyState;
    }

    /* sourceIndex=-1 if the current character began in the previous buffer */
    sourceIndex=byteIndex==0 ? 0 : -1;
    nextSourceIndex=0;

    /* conversion loop */
    while(source<sourceLimit) {
        /*
         * This following test is to see if available input would overflow the output.
         * It does not catch output of more than one code unit that
         * overflows as a result of a surrogate pair or callback output
         * from the last source byte.
         * Therefore, those situations also test for overflows and will
         * then break the loop, too.
         */
        if(target>=targetLimit) {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }

        if(byteIndex==0) {
            /* optimized loop for 1/2-byte input and BMP output */
            if(offsets==NULL) {
                do {
                    entry=stateTable[state][*source];
                    if(MBCS_ENTRY_IS_TRANSITION(entry)) {
                        state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
                        offset=MBCS_ENTRY_TRANSITION_OFFSET(entry);

                        ++source;
                        if( source<sourceLimit &&
                            MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                            MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                            (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
                        ) {
                            ++source;
                            *target++=c;
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                            offset=0;
                        } else {
                            /* set the state and leave the optimized loop */
                            bytes[0]=*(source-1);
                            byteIndex=1;
                            break;
                        }
                    } else {
                        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
                            /* output BMP code point */
                            ++source;
                            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                        } else {
                            /* leave the optimized loop */
                            break;
                        }
                    }
                } while(source<sourceLimit && target<targetLimit);
            } else /* offsets!=NULL */ {
                do {
                    entry=stateTable[state][*source];
                    if(MBCS_ENTRY_IS_TRANSITION(entry)) {
                        state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
                        offset=MBCS_ENTRY_TRANSITION_OFFSET(entry);

                        ++source;
                        if( source<sourceLimit &&
                            MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                            MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                            (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
                        ) {
                            ++source;
                            *target++=c;
                            if(offsets!=NULL) {
                                *offsets++=sourceIndex;
                                sourceIndex=(nextSourceIndex+=2);
                            }
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                            offset=0;
                        } else {
                            /* set the state and leave the optimized loop */
                            ++nextSourceIndex;
                            bytes[0]=*(source-1);
                            byteIndex=1;
                            break;
                        }
                    } else {
                        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
                            /* output BMP code point */
                            ++source;
                            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                            if(offsets!=NULL) {
                                *offsets++=sourceIndex;
                                sourceIndex=++nextSourceIndex;
                            }
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                        } else {
                            /* leave the optimized loop */
                            break;
                        }
                    }
                } while(source<sourceLimit && target<targetLimit);
            }

            /*
             * these tests and break statements could be put inside the loop
             * if C had "break outerLoop" like Java
             */
            if(source>=sourceLimit) {
                break;
            }
            if(target>=targetLimit) {
                /* target is full */
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
                break;
            }

            ++nextSourceIndex;
            bytes[byteIndex++]=*source++;
        } else /* byteIndex>0 */ {
            ++nextSourceIndex;
            entry=stateTable[state][bytes[byteIndex++]=*source++];
        }

        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);
            continue;
        }

        /* save the previous state for proper extension mapping with SI/SO-stateful converters */
        cnv->mode=state;

        /* set the next state early so that we can reuse the entry variable */
        state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */

        /*
         * An if-else-if chain provides more reliable performance for
         * the most common cases compared to a switch.
         */
        action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
        if(action==MBCS_STATE_VALID_16) {
            offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
            c=unicodeCodeUnits[offset];
            if(c<0xfffe) {
                /* output BMP code point */
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(c==0xfffe) {
                if(UCNV_TO_U_USE_FALLBACK(cnv) && (entry=(int32_t)ucnv_MBCSGetFallback(&cnv->sharedData->mbcs, offset))!=0xfffe) {
                    /* output fallback BMP code point */
                    *target++=(UChar)entry;
                    if(offsets!=NULL) {
                        *offsets++=sourceIndex;
                    }
                    byteIndex=0;
                }
            } else {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_VALID_DIRECT_16) {
            /* output BMP code point */
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            if(offsets!=NULL) {
                *offsets++=sourceIndex;
            }
            byteIndex=0;
        } else if(action==MBCS_STATE_VALID_16_PAIR) {
            offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
            c=unicodeCodeUnits[offset++];
            if(c<0xd800) {
                /* output BMP code point below 0xd800 */
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                /* output roundtrip or fallback surrogate pair */
                *target++=(UChar)(c&0xdbff);
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
                if(target<targetLimit) {
                    *target++=unicodeCodeUnits[offset];
                    if(offsets!=NULL) {
                        *offsets++=sourceIndex;
                    }
                } else {
                    /* target overflow */
                    cnv->UCharErrorBuffer[0]=unicodeCodeUnits[offset];
                    cnv->UCharErrorBufferLength=1;
                    *pErrorCode=U_BUFFER_OVERFLOW_ERROR;

                    offset=0;
                    break;
                }
            } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                *target++=unicodeCodeUnits[offset];
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(c==0xffff) {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_VALID_DIRECT_20 ||
                  (action==MBCS_STATE_FALLBACK_DIRECT_20 && UCNV_TO_U_USE_FALLBACK(cnv))
        ) {
            entry=MBCS_ENTRY_FINAL_VALUE(entry);
            /* output surrogate pair */
            *target++=(UChar)(0xd800|(UChar)(entry>>10));
            if(offsets!=NULL) {
                *offsets++=sourceIndex;
            }
            byteIndex=0;
            c=(UChar)(0xdc00|(UChar)(entry&0x3ff));
            if(target<targetLimit) {
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
            } else {
                /* target overflow */
                cnv->UCharErrorBuffer[0]=c;
                cnv->UCharErrorBufferLength=1;
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;

                offset=0;
                break;
            }
        } else if(action==MBCS_STATE_CHANGE_ONLY) {
            /*
             * This serves as a state change without any output.
             * It is useful for reading simple stateful encodings,
             * for example using just Shift-In/Shift-Out codes.
             * The 21 unused bits may later be used for more sophisticated
             * state transitions.
             */
            if(cnv->sharedData->mbcs.dbcsOnlyState==0) {
                byteIndex=0;
            } else {
                /* SI/SO are illegal for DBCS-only conversion */
                state=(uint8_t)(cnv->mode); /* restore the previous state */

                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
            if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                /* output BMP code point */
                *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            }
        } else if(action==MBCS_STATE_UNASSIGNED) {
            /* just fall through */
        } else if(action==MBCS_STATE_ILLEGAL) {
            /* callback(illegal) */
            *pErrorCode=U_ILLEGAL_CHAR_FOUND;
        } else {
            /* reserved, must never occur */
            byteIndex=0;
        }

        /* end of action codes: prepare for a new character */
        offset=0;

        if(byteIndex==0) {
            sourceIndex=nextSourceIndex;
        } else if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            if(byteIndex>1) {
                /*
                 * Ticket 5691: consistent illegal sequences:
                 * - We include at least the first byte in the illegal sequence.
                 * - If any of the non-initial bytes could be the start of a character,
                 *   we stop the illegal sequence before the first one of those.
                 */
                UBool isDBCSOnly=(UBool)(cnv->sharedData->mbcs.dbcsOnlyState!=0);
                int8_t i;
                for(i=1;
                    i<byteIndex && !isSingleOrLead(stateTable, state, isDBCSOnly, bytes[i]);
                    ++i) {}
                if(i<byteIndex) {
                    /* Back out some bytes. */
                    int8_t backOutDistance=byteIndex-i;
                    int32_t bytesFromThisBuffer=(int32_t)(source-(const uint8_t *)pArgs->source);
                    byteIndex=i;  /* length of reported illegal byte sequence */
                    if(backOutDistance<=bytesFromThisBuffer) {
                        source-=backOutDistance;
                    } else {
                        /* Back out bytes from the previous buffer: Need to replay them. */
                        cnv->preToULength=(int8_t)(bytesFromThisBuffer-backOutDistance);
                        /* preToULength is negative! */
                        uprv_memcpy(cnv->preToU, bytes+i, -cnv->preToULength);
                        source=(const uint8_t *)pArgs->source;
                    }
                }
            }
            break;
        } else /* unassigned sequences indicated with byteIndex>0 */ {
            /* try an extension mapping */
            pArgs->source=(const char *)source;
            byteIndex=_extToU(cnv, cnv->sharedData,
                              byteIndex, &source, sourceLimit,
                              &target, targetLimit,
                              &offsets, sourceIndex,
                              pArgs->flush,
                              pErrorCode);
            sourceIndex=nextSourceIndex+=(int32_t)(source-(const uint8_t *)pArgs->source);

            if(U_FAILURE(*pErrorCode)) {
                /* not mappable or buffer overflow */
                break;
            }
        }
    }

    /* set the converter state back into UConverter */
    cnv->toUnicodeStatus=offset;
    cnv->mode=state;
    cnv->toULength=byteIndex;

    /* write back the updated pointers */
    pArgs->source=(const char *)source;
    pArgs->target=target;
    pArgs->offsets=offsets;
}